

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedVarintT<true,bool,(unsigned_short)0>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  RepeatedField<bool> *this;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  void *pvVar6;
  uint32_t *data_00;
  ulong uVar7;
  char *pcVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_01;
  uint *puVar11;
  byte *p;
  long *ptr_00;
  uint value;
  ulong uVar12;
  long *plVar13;
  uint uVar14;
  uint res;
  pair<const_char_*,_unsigned_int> pVar15;
  uint local_50;
  
  puVar11 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar11 & 3) != 0) {
    AlignFail(puVar11);
  }
  uVar2 = *(ushort *)((long)puVar11 + 10);
  ptr_00 = (long *)0x1;
  pvVar6 = MaybeGetSplitBase(msg,true,table);
  plVar13 = (long *)((ulong)*puVar11 + (long)pvVar6);
  if (((ulong)plVar13 & 7) != 0) {
    AlignFail(plVar13);
  }
  uVar14 = uVar2 & 0x600;
  ctx_00 = extraout_RDX;
  if ((undefined1 *)*plVar13 == kZeroBuffer) {
    ptr_00 = plVar13;
    MpRepeatedVarintT<true,bool,(unsigned_short)0>();
    ctx_00 = extraout_RDX_01;
  }
  if ((uVar2 >> 10 & 1) == 0) {
    data_00 = (uint32_t *)0x0;
  }
  else {
    data_00 = *(uint32_t **)
               ((long)&table->has_bits_offset +
               (ulong)(ushort)puVar11[2] * 8 + (ulong)table->aux_offset);
    ctx_00 = (ParseContext *)table;
  }
  this = (RepeatedField<bool> *)*plVar13;
  aVar9._0_4_ = (uint)(short)data_00;
  aVar9.data._4_4_ = 0;
  aVar10 = aVar9;
  res = uVar14;
  do {
    uVar12 = (ulong)*ptr;
    if ((long)uVar12 < 0) {
      uVar7 = (long)(char)((byte *)ptr)[1] << 7 | 0x7f;
      if ((long)uVar7 < 0) {
        aVar10.data = (long)(char)((byte *)ptr)[2] << 0xe | 0x3fff;
        if ((long)aVar10 < 0) {
          ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[3] << 0x15 | 0x1fffff);
          uVar7 = uVar7 & (ulong)ctx_00;
          if ((long)uVar7 < 0) {
            ptr_00 = (long *)0xffffffffffffff80;
            ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[4] << 0x1c | 0xfffffff);
            aVar10.data = aVar10.data & (ulong)ctx_00;
            if ((long)aVar10.data < 0) {
              ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[5] << 0x23 | 0x7ffffffff);
              uVar7 = uVar7 & (ulong)ctx_00;
              if ((long)uVar7 < 0) {
                ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[6] << 0x2a | 0x3ffffffffff);
                aVar10.data = aVar10.data & (ulong)ctx_00;
                if ((long)aVar10 < 0) {
                  ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[7] << 0x31 | 0x1ffffffffffff);
                  uVar7 = uVar7 & (ulong)ctx_00;
                  if ((long)uVar7 < 0) {
                    ctx_00 = (ParseContext *)((ulong)((byte *)ptr)[8] << 0x38 | 0xffffffffffffff);
                    aVar10.data = aVar10.data & (ulong)ctx_00;
                    if ((long)aVar10 < 0) {
                      p = (byte *)ptr + 10;
                      if (((byte *)ptr)[9] != 1) {
                        bVar1 = ((byte *)ptr)[9];
                        ctx_00 = (ParseContext *)CONCAT71((int7)((ulong)ctx_00 >> 8),bVar1);
                        if ((char)bVar1 < '\0') {
                          p = (byte *)0x0;
                          goto LAB_0016155d;
                        }
                        if ((bVar1 & 1) == 0) {
                          aVar10.data = aVar10.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      p = (byte *)ptr + 9;
                    }
                  }
                  else {
                    p = (byte *)ptr + 8;
                  }
                }
                else {
                  p = (byte *)ptr + 7;
                }
              }
              else {
                p = (byte *)ptr + 6;
              }
            }
            else {
              p = (byte *)ptr + 5;
            }
          }
          else {
            p = (byte *)ptr + 4;
          }
        }
        else {
          p = (byte *)ptr + 3;
        }
        uVar7 = uVar7 & aVar10.data;
      }
      else {
        p = (byte *)ptr + 2;
      }
      uVar12 = uVar12 & uVar7;
    }
    else {
      p = (byte *)ptr + 1;
    }
LAB_0016155d:
    if (p == (byte *)0x0) {
      iVar5 = 4;
    }
    else {
      value = (uint)uVar12;
      if ((uVar2 >> 10 & 1) == 0) {
        if (uVar14 == 0x200) {
          uVar12 = (ulong)(int)(-(value & 1) ^ (uint)(uVar12 >> 1) & 0x7fffffff);
        }
      }
      else {
        if (uVar14 == 0x600) {
          aVar10._1_7_ = (undefined7)((ulong)aVar10 >> 8);
          aVar10.data._0_1_ = (int)aVar9._0_4_ <= (int)value;
          bVar4 = (int)value < (int)(((uint)((ulong)data_00 >> 0x10) & 0xffff) + aVar9._0_4_) &&
                  (int)aVar9._0_4_ <= (int)value;
        }
        else {
          bVar4 = ValidateEnum(value,data_00);
        }
        if (bVar4 == false) {
          pcVar8 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
          return pcVar8;
        }
      }
      ptr_00 = (long *)(ulong)(uVar12 != 0);
      RepeatedField<bool>::Add(this,uVar12 != 0);
      pVar15._8_8_ = extraout_RDX_00;
      pVar15.first = (char *)ctx;
      if (p < (ctx->super_EpsCopyInputStream).limit_end_) {
        res = (uint)*p;
        ptr = (char *)(p + 1);
        if ((char)*p < '\0') {
          bVar1 = *ptr;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = extraout_RDX_00;
          pVar15 = (pair<const_char_*,_unsigned_int>)(auVar3 << 0x40);
          aVar10.data = (ulong)bVar1 << 7;
          res = (res + (uint)bVar1 * 0x80) - 0x80;
          if ((char)bVar1 < '\0') {
            ptr_00 = (long *)(ulong)res;
            pVar15 = ReadTagFallback((char *)p,res);
            ptr = pVar15.first;
            res = pVar15.second;
          }
          else {
            ptr = (char *)(p + 2);
          }
        }
        ctx_00 = pVar15._8_8_;
        iVar5 = (uint)((byte *)ptr == (byte *)0x0) << 2;
      }
      else {
        iVar5 = 5;
        ctx_00 = extraout_RDX_00;
      }
    }
    if (iVar5 != 0) {
      if (iVar5 == 4) {
        pcVar8 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)aVar10,table,hasbits);
        return pcVar8;
      }
      goto LAB_00161758;
    }
    local_50 = data.field_0._0_4_;
    if (res != local_50) {
LAB_00161758:
      if ((ulong)table->has_bits_offset != 0) {
        puVar11 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar11 & 3) != 0) {
          AlignFail();
        }
        *puVar11 = *puVar11 | (uint)hasbits;
      }
      return (char *)p;
    }
  } while( true );
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}